

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

Array2D<double> * __thiscall
pbrt::Array2D<double>::operator=(Array2D<double> *this,Array2D<double> *other)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  memory_resource *pmVar6;
  double *pdVar7;
  double *pdVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  Tuple2<pbrt::Point2,_int> TVar10;
  Tuple2<pbrt::Point2,_int> TVar11;
  int iVar12;
  undefined4 extraout_var;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  Bounds2<int> tmp;
  
  pmVar6 = (this->allocator).memoryResource;
  if (pmVar6 == (other->allocator).memoryResource) {
    TVar9 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    TVar10 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    TVar11 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
         (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
    (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar11;
    (other->extent).pMin.super_Tuple2<pbrt::Point2,_int> = TVar9;
    (other->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar10;
    pdVar7 = this->values;
    this->values = other->values;
    other->values = pdVar7;
  }
  else {
    iVar1 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar12 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    iVar2 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
    iVar3 = (this->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    if (iVar12 == iVar3 && iVar1 == iVar2) {
      iVar4 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar16 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      iVar5 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
      iVar15 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      if (iVar16 == iVar5 && iVar4 == iVar15) {
        uVar13 = (iVar5 - iVar12) * (iVar4 - iVar1);
        if (0 < (int)uVar13) {
          pdVar7 = this->values;
          pdVar8 = other->values;
          uVar14 = 0;
          do {
            pdVar7[uVar14] = pdVar8[uVar14];
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        TVar9 = (other->extent).pMax.super_Tuple2<pbrt::Point2,_int>;
        (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
             (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>;
        (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar9;
        return this;
      }
    }
    else {
      iVar15 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x;
      iVar16 = (this->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y;
    }
    if (this->values != (double *)0x0) {
      (*pmVar6->_vptr_memory_resource[3])
                (pmVar6,this->values,(long)((iVar15 - iVar2) * (iVar16 - iVar3)) << 3,8);
      iVar1 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.x;
      iVar12 = (other->extent).pMin.super_Tuple2<pbrt::Point2,_int>.y;
    }
    uVar13 = ((other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.y - iVar12) *
             ((other->extent).pMax.super_Tuple2<pbrt::Point2,_int>.x - iVar1);
    if (uVar13 == 0) {
      this->values = (double *)0x0;
    }
    else {
      pmVar6 = (this->allocator).memoryResource;
      iVar12 = (*pmVar6->_vptr_memory_resource[2])(pmVar6,(long)(int)uVar13 << 3,8);
      this->values = (double *)CONCAT44(extraout_var,iVar12);
      if (0 < (int)uVar13) {
        pdVar7 = other->values;
        uVar14 = 0;
        do {
          ((double *)CONCAT44(extraout_var,iVar12))[uVar14] = pdVar7[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar13 != uVar14);
      }
    }
  }
  return this;
}

Assistant:

Array2D &operator=(Array2D &&other) {
        if (allocator == other.allocator) {
            pstd::swap(extent, other.extent);
            pstd::swap(values, other.values);
        } else if (extent == other.extent) {
            int n = extent.Area();
            for (int i = 0; i < n; ++i) {
                allocator.destroy(values + i);
                allocator.construct(values + i, other.values[i]);
            }
            extent = other.extent;
        } else {
            int n = extent.Area();
            for (int i = 0; i < n; ++i)
                allocator.destroy(values + i);
            allocator.deallocate_object(values, n);

            int no = other.extent.Area();
            values = allocator.allocate_object<T>(no);
            for (int i = 0; i < no; ++i)
                allocator.construct(values + i, other.values[i]);
        }
        return *this;
    }